

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  size_type *psVar7;
  char *pcVar8;
  size_type __len1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type __len2;
  string positive;
  string negative;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &local_b0.field_2;
  pcVar2 = (test_suite_name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + test_suite_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar4[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  pcVar8 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar5 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (pcVar5 == (char *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(pcVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,0,pcVar8,sVar6);
    pcVar8 = "";
    this = &local_70;
    __len2 = 0;
    __len1 = local_70._M_string_length;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar8,pcVar5);
    this = &local_b0;
    std::__cxx11::string::operator=((string *)this,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    local_50[0] = local_40;
    sVar6 = strlen(pcVar5 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pcVar5 + 1,pcVar5 + sVar6 + 1);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_b0._M_string_length != 0) goto LAB_0012afbf;
    __len2 = 1;
    pcVar8 = "*";
    __len1 = 0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (this,0,__len1,pcVar8,__len2);
LAB_0012afbf:
  bVar3 = MatchesFilter(&local_90,local_b0._M_dataplus._M_p);
  if (bVar3) {
    bVar3 = MatchesFilter(&local_90,local_70._M_dataplus._M_p);
    bVar3 = !bVar3;
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  const std::string& full_name = test_suite_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == nullptr) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}